

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnetworkreplyimpl.cpp
# Opt level: O2

void __thiscall QNetworkReplyImplPrivate::initCacheSaveDevice(QNetworkReplyImplPrivate *this)

{
  QUrl *url;
  QNetworkReply *this_00;
  char cVar1;
  int iVar2;
  QAbstractNetworkCache *pQVar3;
  QIODevice *pQVar4;
  undefined8 uVar5;
  long in_FS_OFFSET;
  AttributesMap attributes;
  Attribute local_64;
  QNetworkCacheMetaData metaData;
  anon_union_24_3_e3d07ef4_for_data local_58;
  undefined1 *puStack_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QNetworkReply **)&(this->super_QNetworkReplyPrivate).field_0x8;
  QNetworkReply::attribute((QVariant *)&local_58,this_00,HttpStatusCodeAttribute);
  iVar2 = QVariant::toInt((bool *)local_58.data);
  QVariant::~QVariant((QVariant *)&local_58);
  if (iVar2 == 0xce) {
    this->cacheEnabled = false;
    goto LAB_00190679;
  }
  metaData.d.d.ptr = (QSharedDataPointer<QNetworkCacheMetaDataPrivate>)&DAT_aaaaaaaaaaaaaaaa;
  QNetworkCacheMetaData::QNetworkCacheMetaData(&metaData);
  url = &(this->super_QNetworkReplyPrivate).url;
  QNetworkCacheMetaData::setUrl(&metaData,url);
  local_58._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
  puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
  local_58.shared = (PrivateShared *)&DAT_aaaaaaaaaaaaaaaa;
  local_58._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  QNetworkReply::attribute((QVariant *)&local_58,this_00,RedirectionTargetAttribute);
  if ((undefined1 *)0x3 < puStack_40) {
    attributes.d._0_4_ = 0xaaaaaaaa;
    attributes.d._4_4_ = 0xaaaaaaaa;
    QNetworkCacheMetaData::attributes(&metaData);
    local_64 = RedirectionTargetAttribute;
    QHash<QNetworkRequest::Attribute,QVariant>::emplace<QVariant_const&>
              ((QHash<QNetworkRequest::Attribute,QVariant> *)&attributes,&local_64,
               (QVariant *)&local_58);
    QNetworkCacheMetaData::setAttributes(&metaData,&attributes);
    QHash<QNetworkRequest::Attribute,_QVariant>::~QHash(&attributes);
  }
  pQVar3 = networkCache(this);
  pQVar4 = (QIODevice *)(**(code **)(*(long *)pQVar3 + 0x88))(pQVar3,&metaData);
  this->cacheSaveDevice = pQVar4;
  if (pQVar4 == (QIODevice *)0x0) {
LAB_00190642:
    pQVar3 = networkCache(this);
    (**(code **)(*(long *)pQVar3 + 0x78))(pQVar3,url);
    this->cacheSaveDevice = (QIODevice *)0x0;
    this->cacheEnabled = false;
  }
  else {
    cVar1 = QIODevice::isOpen();
    if (cVar1 == '\0') {
      if (this->cacheSaveDevice != (QIODevice *)0x0) {
        cVar1 = QIODevice::isOpen();
        if (cVar1 == '\0') {
          attributes.d._0_4_ = 2;
          attributes.d._4_4_ = 0;
          pQVar3 = networkCache(this);
          (*(code *)**(undefined8 **)pQVar3)(pQVar3);
          uVar5 = QMetaObject::className();
          QMessageLogger::critical
                    ((char *)&attributes,
                     "QNetworkReplyImpl: network cache returned a device that is not open -- class %s probably needs to be fixed"
                     ,uVar5);
        }
      }
      goto LAB_00190642;
    }
  }
  QVariant::~QVariant((QVariant *)&local_58);
  QNetworkCacheMetaData::~QNetworkCacheMetaData(&metaData);
LAB_00190679:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QNetworkReplyImplPrivate::initCacheSaveDevice()
{
    Q_Q(QNetworkReplyImpl);

    // The disk cache does not support partial content, so don't even try to
    // save any such content into the cache.
    if (q->attribute(QNetworkRequest::HttpStatusCodeAttribute).toInt() == 206) {
        cacheEnabled = false;
        return;
    }

    // save the meta data
    QNetworkCacheMetaData metaData;
    metaData.setUrl(url);
    // @todo @future: fetchCacheMetaData is not currently implemented in any backend, but can be useful again in the future
    // metaData = backend->fetchCacheMetaData(metaData);

    // save the redirect request also in the cache
    QVariant redirectionTarget = q->attribute(QNetworkRequest::RedirectionTargetAttribute);
    if (redirectionTarget.isValid()) {
        QNetworkCacheMetaData::AttributesMap attributes = metaData.attributes();
        attributes.insert(QNetworkRequest::RedirectionTargetAttribute, redirectionTarget);
        metaData.setAttributes(attributes);
    }

    cacheSaveDevice = networkCache()->prepare(metaData);

    if (!cacheSaveDevice || !cacheSaveDevice->isOpen()) {
        if (Q_UNLIKELY(cacheSaveDevice && !cacheSaveDevice->isOpen()))
            qCritical("QNetworkReplyImpl: network cache returned a device that is not open -- "
                  "class %s probably needs to be fixed",
                  networkCache()->metaObject()->className());

        networkCache()->remove(url);
        cacheSaveDevice = nullptr;
        cacheEnabled = false;
    }
}